

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_new_promise_capability(JSContext *ctx,JSValue *resolving_funcs,JSValue ctor)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue func_obj;
  JSValue v_02;
  JSValue JVar1;
  int iVar2;
  void *pvVar3;
  JSValueUnion *pJVar4;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  long in_RSI;
  JSContext *in_RDI;
  JSValue JVar5;
  JSValue JVar6;
  int i;
  JSCFunctionDataRecord *s;
  JSValue result_promise;
  JSValue executor;
  JSValueUnion in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  JSValueUnion in_stack_ffffffffffffff70;
  JSValueUnion in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  JSValueUnion local_78;
  JSContext *in_stack_ffffffffffffff90;
  JSValueUnion local_68;
  int local_5c;
  JSValueUnion local_50;
  JSValueUnion local_48;
  int32_t local_10;
  undefined4 uStack_c;
  JSValueUnion local_8;
  
  JVar5 = js_promise_executor_new(in_stack_ffffffffffffff90);
  local_68 = (JSValueUnion)JVar5.tag;
  iVar2 = JS_IsException(JVar5);
  if (iVar2 == 0) {
    JVar6.tag = in_RCX;
    JVar6.u.float64 = in_RDX.float64;
    iVar2 = JS_IsUndefined(JVar6);
    if (iVar2 == 0) {
      func_obj.tag = in_stack_ffffffffffffff80;
      func_obj.u.float64 = in_stack_ffffffffffffff78.float64;
      JVar6 = JS_CallConstructor((JSContext *)in_stack_ffffffffffffff70.ptr,func_obj,
                                 in_stack_ffffffffffffff6c,(JSValue *)in_stack_ffffffffffffff60.ptr)
      ;
      in_stack_ffffffffffffff70 = JVar6.u;
      in_stack_ffffffffffffff78 = (JSValueUnion)JVar6.tag;
      local_50 = in_stack_ffffffffffffff70;
      local_48 = in_stack_ffffffffffffff78;
    }
    else {
      JVar6 = js_promise_constructor
                        ((JSContext *)result_promise.tag,executor,result_promise.u._4_4_,
                         (JSValue *)s);
      local_50 = JVar6.u;
      local_78 = (JSValueUnion)JVar6.tag;
      local_48 = local_78;
    }
    v_02.tag = (int64_t)local_48.ptr;
    v_02.u.float64 = local_50.float64;
    iVar2 = JS_IsException(v_02);
    if (iVar2 == 0) {
      pvVar3 = JS_GetOpaque(JVar5,0xf);
      for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
        JVar5.tag = (int64_t)in_stack_ffffffffffffff78.ptr;
        JVar5.u.ptr = in_stack_ffffffffffffff70.ptr;
        iVar2 = check_function((JSContext *)
                               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),JVar5);
        if (iVar2 != 0) goto LAB_0014c17a;
      }
      for (local_5c = 0; local_5c < 2; local_5c = local_5c + 1) {
        pJVar4 = (JSValueUnion *)(in_RSI + (long)local_5c * 0x10);
        JVar5 = JS_DupValue(in_RDI,*(JSValue *)((long)pvVar3 + (long)local_5c * 0x10 + 0x10));
        in_stack_ffffffffffffff60 = JVar5.u;
        in_stack_ffffffffffffff68 = (undefined4)JVar5.tag;
        in_stack_ffffffffffffff6c = JVar5.tag._4_4_;
        pJVar4->ptr = (void *)in_stack_ffffffffffffff60;
        pJVar4[1] = (JSValueUnion)JVar5.tag;
      }
      v.u._4_4_ = in_stack_ffffffffffffff6c;
      v.u.int32 = in_stack_ffffffffffffff68;
      v.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
      JS_FreeValue((JSContext *)in_stack_ffffffffffffff60.ptr,v);
      local_10 = local_50.int32;
      uStack_c = local_50._4_4_;
      local_8.float64 = local_48.float64;
    }
    else {
LAB_0014c17a:
      v_00.u._4_4_ = in_stack_ffffffffffffff6c;
      v_00.u.int32 = in_stack_ffffffffffffff68;
      v_00.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
      JS_FreeValue((JSContext *)in_stack_ffffffffffffff60.ptr,v_00);
      v_01.u._4_4_ = in_stack_ffffffffffffff6c;
      v_01.u.int32 = in_stack_ffffffffffffff68;
      v_01.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
      JS_FreeValue((JSContext *)in_stack_ffffffffffffff60.ptr,v_01);
      local_10 = 0;
      local_8.float64 = 2.96439387504748e-323;
    }
  }
  else {
    local_10 = JVar5.u._0_4_;
    uStack_c = JVar5.u._4_4_;
    local_8 = local_68;
  }
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8.ptr;
  return JVar1;
}

Assistant:

static JSValue js_new_promise_capability(JSContext *ctx,
                                         JSValue *resolving_funcs,
                                         JSValueConst ctor)
{
    JSValue executor, result_promise;
    JSCFunctionDataRecord *s;
    int i;

    executor = js_promise_executor_new(ctx);
    if (JS_IsException(executor))
        return executor;

    if (JS_IsUndefined(ctor)) {
        result_promise = js_promise_constructor(ctx, ctor, 1,
                                                (JSValueConst *)&executor);
    } else {
        result_promise = JS_CallConstructor(ctx, ctor, 1,
                                            (JSValueConst *)&executor);
    }
    if (JS_IsException(result_promise))
        goto fail;
    s = JS_GetOpaque(executor, JS_CLASS_C_FUNCTION_DATA);
    for(i = 0; i < 2; i++) {
        if (check_function(ctx, s->data[i]))
            goto fail;
    }
    for(i = 0; i < 2; i++)
        resolving_funcs[i] = JS_DupValue(ctx, s->data[i]);
    JS_FreeValue(ctx, executor);
    return result_promise;
 fail:
    JS_FreeValue(ctx, executor);
    JS_FreeValue(ctx, result_promise);
    return JS_EXCEPTION;
}